

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

int Abc_NtkFxCheck(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int local_24;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_24) {
      return 1;
    }
    pObj = Abc_NtkObj(pNtk,local_24);
    if (((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) &&
       (iVar1 = Vec_IntCheckUniqueSmall(&pObj->vFanins), iVar1 == 0)) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int Abc_NtkFxCheck( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
//    Abc_NtkForEachObj( pNtk, pNode, i )
//        Abc_ObjPrint( stdout, pNode );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Vec_IntCheckUniqueSmall( &pNode->vFanins ) )
            return 0;
    return 1;
}